

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_harley_seal_improved(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  __m256i c_06;
  __m256i c_07;
  __m256i c_08;
  __m256i c_09;
  __m256i c_10;
  __m256i c_11;
  __m256i c_12;
  __m256i c_13;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  __m256i b_13;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  long lVar27;
  int *in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int j_4;
  size_t i_6;
  int j_3;
  size_t i_5;
  int j_2;
  size_t i_4;
  int j_1;
  size_t i_3;
  __m256i mask_byte0_1;
  __m256i tmp1_5;
  __m256i tmp0_5;
  __m256i t2_1;
  __m256i tmp1_4;
  __m256i tmp0_4;
  __m256i t1_1;
  __m256i tmp1_3;
  __m256i tmp0_3;
  __m256i t0_1;
  __m256i mask_byte0;
  __m256i tmp1_2;
  __m256i tmp0_2;
  __m256i t2;
  __m256i tmp1_1;
  __m256i tmp0_1;
  __m256i t1;
  __m256i tmp1;
  __m256i tmp0;
  __m256i t0;
  size_t thislimit;
  size_t i_2;
  __m256i counter [4];
  uint16_t buffer [16];
  uint64_t i;
  uint64_t limit;
  __m256i eightsB;
  __m256i eightsA;
  __m256i foursB;
  __m256i foursA;
  __m256i twosB;
  __m256i twosA;
  __m256i v16;
  __m256i v8;
  __m256i v4;
  __m256i v2;
  __m256i v1;
  size_t size;
  __m256i *data;
  int j;
  uint32_t i_1;
  undefined1 in_stack_ffffffffffffe9d8;
  undefined1 in_stack_ffffffffffffe9d9;
  undefined1 in_stack_ffffffffffffe9da;
  undefined1 in_stack_ffffffffffffe9db;
  undefined4 in_stack_ffffffffffffe9dc;
  undefined1 *in_stack_ffffffffffffe9e0;
  undefined1 *puVar30;
  undefined1 *in_stack_ffffffffffffe9f0;
  undefined8 *puVar31;
  undefined1 *in_stack_ffffffffffffea00;
  undefined8 *in_stack_ffffffffffffea08;
  undefined8 *in_stack_ffffffffffffea10;
  int local_15dc;
  __m256i *in_stack_ffffffffffffea28;
  ulong uVar32;
  undefined4 in_stack_ffffffffffffea30;
  undefined4 in_stack_ffffffffffffea34;
  int iVar33;
  ulong local_15c8;
  int local_15bc;
  ulong local_15b8;
  int local_15ac;
  ulong local_15a8;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  ulong local_1310;
  ulong local_1308;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  ulong local_1250;
  ulong local_1248;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  ulong local_10d0;
  long local_10c8;
  int local_10c0;
  uint local_10bc;
  int *local_10b8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [32];
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [32];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 local_f00 [32];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined1 local_e80 [32];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_e00 [32];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  long local_d88;
  long local_d80;
  long local_d78;
  long local_d70;
  long local_d68;
  long local_d60;
  long local_d58;
  long local_d50;
  long local_d48;
  long local_d40;
  long local_d38;
  long local_d30;
  long local_d28;
  long local_d20;
  long local_d18;
  long local_d10;
  undefined4 local_d08;
  undefined4 local_d04;
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [32];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [32];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [32];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined4 local_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined4 local_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined4 local_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined4 local_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined4 local_9e4;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined4 local_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined4 local_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined4 local_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined4 local_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined4 local_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined4 local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined4 local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_64c;
  undefined1 local_64b;
  undefined1 local_64a;
  undefined1 local_649;
  undefined1 local_648;
  undefined1 local_647;
  undefined1 local_646;
  undefined1 local_645;
  undefined1 local_644;
  undefined1 local_643;
  undefined1 local_642;
  undefined1 local_641;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined1 local_320;
  undefined1 local_31f;
  undefined1 local_31e;
  undefined1 local_31d;
  undefined1 local_31c;
  undefined1 local_31b;
  undefined1 local_31a;
  undefined1 local_319;
  undefined1 local_318;
  undefined1 local_317;
  undefined1 local_316;
  undefined1 local_315;
  undefined1 local_314;
  undefined1 local_313;
  undefined1 local_312;
  undefined1 local_311;
  undefined1 local_310;
  undefined1 local_30f;
  undefined1 local_30e;
  undefined1 local_30d;
  undefined1 local_30c;
  undefined1 local_30b;
  undefined1 local_30a;
  undefined1 local_309;
  undefined1 local_308;
  undefined1 local_307;
  undefined1 local_306;
  undefined1 local_305;
  undefined1 local_304;
  undefined1 local_303;
  undefined1 local_302;
  undefined1 local_301;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined1 local_2e0;
  undefined1 local_2df;
  undefined1 local_2de;
  undefined1 local_2dd;
  undefined1 local_2dc;
  undefined1 local_2db;
  undefined1 local_2da;
  undefined1 local_2d9;
  undefined1 local_2d8;
  undefined1 local_2d7;
  undefined1 local_2d6;
  undefined1 local_2d5;
  undefined1 local_2d4;
  undefined1 local_2d3;
  undefined1 local_2d2;
  undefined1 local_2d1;
  undefined1 local_2d0;
  undefined1 local_2cf;
  undefined1 local_2ce;
  undefined1 local_2cd;
  undefined1 local_2cc;
  undefined1 local_2cb;
  undefined1 local_2ca;
  undefined1 local_2c9;
  undefined1 local_2c8;
  undefined1 local_2c7;
  undefined1 local_2c6;
  undefined1 local_2c5;
  undefined1 local_2c4;
  undefined1 local_2c3;
  undefined1 local_2c2;
  undefined1 local_2c1;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined1 local_2a0;
  undefined1 local_29f;
  undefined1 local_29e;
  undefined1 local_29d;
  undefined1 local_29c;
  undefined1 local_29b;
  undefined1 local_29a;
  undefined1 local_299;
  undefined1 local_298;
  undefined1 local_297;
  undefined1 local_296;
  undefined1 local_295;
  undefined1 local_294;
  undefined1 local_293;
  undefined1 local_292;
  undefined1 local_291;
  undefined1 local_290;
  undefined1 local_28f;
  undefined1 local_28e;
  undefined1 local_28d;
  undefined1 local_28c;
  undefined1 local_28b;
  undefined1 local_28a;
  undefined1 local_289;
  undefined1 local_288;
  undefined1 local_287;
  undefined1 local_286;
  undefined1 local_285;
  undefined1 local_284;
  undefined1 local_283;
  undefined1 local_282;
  undefined1 local_281;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  undefined1 local_255;
  undefined1 local_254;
  undefined1 local_253;
  undefined1 local_252;
  undefined1 local_251;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_24e;
  undefined1 local_24d;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined1 local_24a;
  undefined1 local_249;
  undefined1 local_248;
  undefined1 local_247;
  undefined1 local_246;
  undefined1 local_245;
  undefined1 local_244;
  undefined1 local_243;
  undefined1 local_242;
  undefined1 local_241;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220;
  undefined1 local_21f;
  undefined1 local_21e;
  undefined1 local_21d;
  undefined1 local_21c;
  undefined1 local_21b;
  undefined1 local_21a;
  undefined1 local_219;
  undefined1 local_218;
  undefined1 local_217;
  undefined1 local_216;
  undefined1 local_215;
  undefined1 local_214;
  undefined1 local_213;
  undefined1 local_212;
  undefined1 local_211;
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined1 local_1e0;
  undefined1 local_1df;
  undefined1 local_1de;
  undefined1 local_1dd;
  undefined1 local_1dc;
  undefined1 local_1db;
  undefined1 local_1da;
  undefined1 local_1d9;
  undefined1 local_1d8;
  undefined1 local_1d7;
  undefined1 local_1d6;
  undefined1 local_1d5;
  undefined1 local_1d4;
  undefined1 local_1d3;
  undefined1 local_1d2;
  undefined1 local_1d1;
  undefined1 local_1d0;
  undefined1 local_1cf;
  undefined1 local_1ce;
  undefined1 local_1cd;
  undefined1 local_1cc;
  undefined1 local_1cb;
  undefined1 local_1ca;
  undefined1 local_1c9;
  undefined1 local_1c8;
  undefined1 local_1c7;
  undefined1 local_1c6;
  undefined1 local_1c5;
  undefined1 local_1c4;
  undefined1 local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined1 local_1a0;
  undefined1 local_19f;
  undefined1 local_19e;
  undefined1 local_19d;
  undefined1 local_19c;
  undefined1 local_19b;
  undefined1 local_19a;
  undefined1 local_199;
  undefined1 local_198;
  undefined1 local_197;
  undefined1 local_196;
  undefined1 local_195;
  undefined1 local_194;
  undefined1 local_193;
  undefined1 local_192;
  undefined1 local_191;
  undefined1 local_190;
  undefined1 local_18f;
  undefined1 local_18e;
  undefined1 local_18d;
  undefined1 local_18c;
  undefined1 local_18b;
  undefined1 local_18a;
  undefined1 local_189;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined1 local_158;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined1 local_154;
  undefined1 local_153;
  undefined1 local_152;
  undefined1 local_151;
  undefined1 local_150;
  undefined1 local_14f;
  undefined1 local_14e;
  undefined1 local_14d;
  undefined1 local_14c;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  for (local_10bc = in_ESI - (in_ESI & 0xff); local_10bc < in_ESI; local_10bc = local_10bc + 1) {
    for (local_10c0 = 0; local_10c0 < 0x10; local_10c0 = local_10c0 + 1) {
      in_RDX[local_10c0] =
           ((int)((uint)*(ushort *)(in_RDI + (ulong)local_10bc * 2) & 1 << ((byte)local_10c0 & 0x1f)
                 ) >> ((byte)local_10c0 & 0x1f)) + in_RDX[local_10c0];
    }
  }
  local_10d0 = (ulong)(in_ESI >> 4);
  local_760 = 0;
  uStack_758 = 0;
  uStack_750 = 0;
  uStack_748 = 0;
  local_1100 = 0;
  uStack_10f8 = 0;
  uStack_10f0 = 0;
  uStack_10e8 = 0;
  local_780 = 0;
  uStack_778 = 0;
  uStack_770 = 0;
  uStack_768 = 0;
  local_1120 = 0;
  uStack_1118 = 0;
  uStack_1110 = 0;
  uStack_1108 = 0;
  local_7a0 = 0;
  uStack_798 = 0;
  uStack_790 = 0;
  uStack_788 = 0;
  local_1140 = 0;
  uStack_1138 = 0;
  uStack_1130 = 0;
  uStack_1128 = 0;
  local_7c0 = 0;
  uStack_7b8 = 0;
  uStack_7b0 = 0;
  uStack_7a8 = 0;
  local_1160 = 0;
  uStack_1158 = 0;
  uStack_1150 = 0;
  uStack_1148 = 0;
  local_7e0 = 0;
  uStack_7d8 = 0;
  uStack_7d0 = 0;
  uStack_7c8 = 0;
  local_1180 = 0;
  uStack_1178 = 0;
  uStack_1170 = 0;
  uStack_1168 = 0;
  local_1248 = local_10d0 - (local_10d0 & 0xf);
  local_1250 = 0;
  for (local_1308 = 0; local_10c8 = in_RDI, local_10b8 = in_RDX, local_1308 < 4;
      local_1308 = local_1308 + 1) {
    local_800 = 0;
    uStack_7f8 = 0;
    uStack_7f0 = 0;
    uStack_7e8 = 0;
    lVar27 = local_1308 * 0x20;
    *(undefined8 *)(local_1300 + lVar27) = 0;
    *(undefined8 *)(local_1300 + lVar27 + 8) = 0;
    *(undefined8 *)(local_1300 + lVar27 + 0x10) = 0;
    *(undefined8 *)(local_12e0 + lVar27 + -8) = 0;
  }
  while (local_1250 < local_1248) {
    local_1310 = local_1248;
    if (0xffff < local_1248 - local_1250) {
      local_1310 = local_1250 + 0xffff;
    }
    for (; local_1250 < local_1310; local_1250 = local_1250 + 0x10) {
      local_d10 = local_10c8 + local_1250 * 0x20;
      local_d18 = local_10c8 + 0x20 + local_1250 * 0x20;
      puVar30 = local_11a0;
      puVar31 = &local_1100;
      b[1] = (longlong)in_stack_ffffffffffffea00;
      b[0] = (longlong)puVar31;
      b[2] = (longlong)in_stack_ffffffffffffea08;
      b[3] = (longlong)in_stack_ffffffffffffea10;
      c[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c[0]._2_1_ = in_stack_ffffffffffffe9da;
      c[0]._3_1_ = in_stack_ffffffffffffe9db;
      c[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c[1] = (longlong)in_stack_ffffffffffffe9e0;
      c[2] = (longlong)puVar30;
      c[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b,c);
      local_d20 = local_10c8 + 0x40 + local_1250 * 0x20;
      local_d28 = local_10c8 + 0x60 + local_1250 * 0x20;
      in_stack_ffffffffffffe9f0 = local_11c0;
      b_00[1] = (longlong)in_stack_ffffffffffffea00;
      b_00[0] = (longlong)puVar31;
      b_00[2] = (longlong)in_stack_ffffffffffffea08;
      b_00[3] = (longlong)in_stack_ffffffffffffea10;
      c_00[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_00[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_00[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_00[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_00[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_00[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_00[2] = (longlong)puVar30;
      c_00[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_00,c_00);
      in_stack_ffffffffffffe9e0 = local_11e0;
      in_stack_ffffffffffffea08 = &local_1120;
      b_01[1] = (longlong)in_stack_ffffffffffffea00;
      b_01[0] = (longlong)puVar31;
      b_01[2] = (longlong)in_stack_ffffffffffffea08;
      b_01[3] = (longlong)in_stack_ffffffffffffea10;
      c_01[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_01[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_01[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_01[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_01[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_01[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_01[2] = (longlong)puVar30;
      c_01[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_01,c_01);
      local_d30 = local_10c8 + 0x80 + local_1250 * 0x20;
      local_d38 = local_10c8 + 0xa0 + local_1250 * 0x20;
      b_02[1] = (longlong)in_stack_ffffffffffffea00;
      b_02[0] = (longlong)puVar31;
      b_02[2] = (longlong)in_stack_ffffffffffffea08;
      b_02[3] = (longlong)in_stack_ffffffffffffea10;
      c_02[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_02[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_02[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_02[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_02[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_02[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_02[2] = (longlong)puVar30;
      c_02[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_02,c_02);
      local_d40 = local_10c8 + 0xc0 + local_1250 * 0x20;
      local_d48 = local_10c8 + 0xe0 + local_1250 * 0x20;
      b_03[1] = (longlong)in_stack_ffffffffffffea00;
      b_03[0] = (longlong)puVar31;
      b_03[2] = (longlong)in_stack_ffffffffffffea08;
      b_03[3] = (longlong)in_stack_ffffffffffffea10;
      c_03[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_03[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_03[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_03[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_03[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_03[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_03[2] = (longlong)puVar30;
      c_03[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_03,c_03);
      in_stack_ffffffffffffea00 = local_1200;
      b_04[1] = (longlong)in_stack_ffffffffffffea00;
      b_04[0] = (longlong)puVar31;
      b_04[2] = (longlong)in_stack_ffffffffffffea08;
      b_04[3] = (longlong)in_stack_ffffffffffffea10;
      c_04[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_04[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_04[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_04[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_04[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_04[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_04[2] = (longlong)puVar30;
      c_04[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_04,c_04);
      in_stack_ffffffffffffea10 = &local_1140;
      b_05[1] = (longlong)in_stack_ffffffffffffea00;
      b_05[0] = (longlong)puVar31;
      b_05[2] = (longlong)in_stack_ffffffffffffea08;
      b_05[3] = (longlong)in_stack_ffffffffffffea10;
      c_05[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_05[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_05[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_05[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_05[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_05[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_05[2] = (longlong)puVar30;
      c_05[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_05,c_05);
      local_d50 = local_10c8 + 0x100 + local_1250 * 0x20;
      local_d58 = local_10c8 + 0x120 + local_1250 * 0x20;
      b_06[1] = (longlong)in_stack_ffffffffffffea00;
      b_06[0] = (longlong)puVar31;
      b_06[2] = (longlong)in_stack_ffffffffffffea08;
      b_06[3] = (longlong)in_stack_ffffffffffffea10;
      c_06[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_06[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_06[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_06[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_06[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_06[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_06[2] = (longlong)puVar30;
      c_06[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_06,c_06);
      local_d60 = local_10c8 + 0x140 + local_1250 * 0x20;
      local_d68 = local_10c8 + 0x160 + local_1250 * 0x20;
      b_07[1] = (longlong)in_stack_ffffffffffffea00;
      b_07[0] = (longlong)puVar31;
      b_07[2] = (longlong)in_stack_ffffffffffffea08;
      b_07[3] = (longlong)in_stack_ffffffffffffea10;
      c_07[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_07[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_07[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_07[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_07[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_07[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_07[2] = (longlong)puVar30;
      c_07[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_07,c_07);
      b_08[1] = (longlong)in_stack_ffffffffffffea00;
      b_08[0] = (longlong)puVar31;
      b_08[2] = (longlong)in_stack_ffffffffffffea08;
      b_08[3] = (longlong)in_stack_ffffffffffffea10;
      c_08[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_08[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_08[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_08[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_08[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_08[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_08[2] = (longlong)puVar30;
      c_08[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_08,c_08);
      local_d70 = local_10c8 + 0x180 + local_1250 * 0x20;
      local_d78 = local_10c8 + 0x1a0 + local_1250 * 0x20;
      b_09[1] = (longlong)in_stack_ffffffffffffea00;
      b_09[0] = (longlong)puVar31;
      b_09[2] = (longlong)in_stack_ffffffffffffea08;
      b_09[3] = (longlong)in_stack_ffffffffffffea10;
      c_09[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_09[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_09[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_09[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_09[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_09[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_09[2] = (longlong)puVar30;
      c_09[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_09,c_09);
      local_d80 = local_10c8 + 0x1c0 + local_1250 * 0x20;
      local_d88 = local_10c8 + 0x1e0 + local_1250 * 0x20;
      b_10[1] = (longlong)in_stack_ffffffffffffea00;
      b_10[0] = (longlong)puVar31;
      b_10[2] = (longlong)in_stack_ffffffffffffea08;
      b_10[3] = (longlong)in_stack_ffffffffffffea10;
      c_10[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_10[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_10[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_10[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_10[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_10[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_10[2] = (longlong)puVar30;
      c_10[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_10,c_10);
      b_11[1] = (longlong)in_stack_ffffffffffffea00;
      b_11[0] = (longlong)puVar31;
      b_11[2] = (longlong)in_stack_ffffffffffffea08;
      b_11[3] = (longlong)in_stack_ffffffffffffea10;
      c_11[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_11[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_11[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_11[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_11[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_11[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_11[2] = (longlong)puVar30;
      c_11[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_11,c_11);
      b_12[1] = (longlong)in_stack_ffffffffffffea00;
      b_12[0] = (longlong)puVar31;
      b_12[2] = (longlong)in_stack_ffffffffffffea08;
      b_12[3] = (longlong)in_stack_ffffffffffffea10;
      c_12[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_12[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_12[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_12[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_12[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_12[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_12[2] = (longlong)puVar30;
      c_12[3] = (longlong)in_stack_ffffffffffffe9f0;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_12,c_12);
      local_641 = 0x55;
      local_301 = 0x55;
      local_302 = 0x55;
      local_303 = 0x55;
      local_304 = 0x55;
      local_305 = 0x55;
      local_306 = 0x55;
      local_307 = 0x55;
      local_308 = 0x55;
      local_309 = 0x55;
      local_30a = 0x55;
      local_30b = 0x55;
      local_30c = 0x55;
      local_30d = 0x55;
      local_30e = 0x55;
      local_30f = 0x55;
      local_310 = 0x55;
      local_311 = 0x55;
      local_312 = 0x55;
      local_313 = 0x55;
      local_314 = 0x55;
      local_315 = 0x55;
      local_316 = 0x55;
      local_317 = 0x55;
      local_318 = 0x55;
      local_319 = 0x55;
      local_31a = 0x55;
      local_31b = 0x55;
      local_31c = 0x55;
      local_31d = 0x55;
      local_31e = 0x55;
      local_31f = 0x55;
      local_320 = 0x55;
      auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar1 = vpinsrb_avx(auVar1,0x55,2);
      auVar1 = vpinsrb_avx(auVar1,0x55,3);
      auVar1 = vpinsrb_avx(auVar1,0x55,4);
      auVar1 = vpinsrb_avx(auVar1,0x55,5);
      auVar1 = vpinsrb_avx(auVar1,0x55,6);
      auVar1 = vpinsrb_avx(auVar1,0x55,7);
      auVar1 = vpinsrb_avx(auVar1,0x55,8);
      auVar1 = vpinsrb_avx(auVar1,0x55,9);
      auVar1 = vpinsrb_avx(auVar1,0x55,10);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
      local_340 = vpinsrb_avx(auVar1,0x55,0xf);
      auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar1 = vpinsrb_avx(auVar1,0x55,2);
      auVar1 = vpinsrb_avx(auVar1,0x55,3);
      auVar1 = vpinsrb_avx(auVar1,0x55,4);
      auVar1 = vpinsrb_avx(auVar1,0x55,5);
      auVar1 = vpinsrb_avx(auVar1,0x55,6);
      auVar1 = vpinsrb_avx(auVar1,0x55,7);
      auVar1 = vpinsrb_avx(auVar1,0x55,8);
      auVar1 = vpinsrb_avx(auVar1,0x55,9);
      auVar1 = vpinsrb_avx(auVar1,0x55,10);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
      auStack_330 = vpinsrb_avx(auVar1,0x55,0xf);
      local_dc0 = local_1180;
      uStack_db8 = uStack_1178;
      uStack_db0 = uStack_1170;
      uStack_da8 = uStack_1168;
      local_de0 = local_340._0_8_;
      uStack_dd8 = local_340._8_8_;
      uStack_dd0 = auStack_330._0_8_;
      uStack_dc8 = auStack_330._8_8_;
      auVar24._8_8_ = uStack_1178;
      auVar24._0_8_ = local_1180;
      auVar24._16_8_ = uStack_1170;
      auVar24._24_8_ = uStack_1168;
      auVar23._16_8_ = auStack_330._0_8_;
      auVar23._0_16_ = local_340;
      auVar23._24_8_ = auStack_330._8_8_;
      auVar3 = vpand_avx2(auVar24,auVar23);
      local_820 = local_1180;
      uStack_818 = uStack_1178;
      uStack_810 = uStack_1170;
      uStack_808 = uStack_1168;
      local_824 = 1;
      auVar26._8_8_ = uStack_1178;
      auVar26._0_8_ = local_1180;
      auVar26._16_8_ = uStack_1170;
      auVar26._24_8_ = uStack_1168;
      local_e00 = vpsrld_avx2(auVar26,ZEXT416(1));
      local_642 = 0x55;
      local_2c1 = 0x55;
      local_2c2 = 0x55;
      local_2c3 = 0x55;
      local_2c4 = 0x55;
      local_2c5 = 0x55;
      local_2c6 = 0x55;
      local_2c7 = 0x55;
      local_2c8 = 0x55;
      local_2c9 = 0x55;
      local_2ca = 0x55;
      local_2cb = 0x55;
      local_2cc = 0x55;
      local_2cd = 0x55;
      local_2ce = 0x55;
      local_2cf = 0x55;
      local_2d0 = 0x55;
      local_2d1 = 0x55;
      local_2d2 = 0x55;
      local_2d3 = 0x55;
      local_2d4 = 0x55;
      local_2d5 = 0x55;
      local_2d6 = 0x55;
      local_2d7 = 0x55;
      local_2d8 = 0x55;
      local_2d9 = 0x55;
      local_2da = 0x55;
      local_2db = 0x55;
      local_2dc = 0x55;
      local_2dd = 0x55;
      local_2de = 0x55;
      local_2df = 0x55;
      local_2e0 = 0x55;
      auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar1 = vpinsrb_avx(auVar1,0x55,2);
      auVar1 = vpinsrb_avx(auVar1,0x55,3);
      auVar1 = vpinsrb_avx(auVar1,0x55,4);
      auVar1 = vpinsrb_avx(auVar1,0x55,5);
      auVar1 = vpinsrb_avx(auVar1,0x55,6);
      auVar1 = vpinsrb_avx(auVar1,0x55,7);
      auVar1 = vpinsrb_avx(auVar1,0x55,8);
      auVar1 = vpinsrb_avx(auVar1,0x55,9);
      auVar1 = vpinsrb_avx(auVar1,0x55,10);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
      local_300 = vpinsrb_avx(auVar1,0x55,0xf);
      auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
      auVar1 = vpinsrb_avx(auVar1,0x55,2);
      auVar1 = vpinsrb_avx(auVar1,0x55,3);
      auVar1 = vpinsrb_avx(auVar1,0x55,4);
      auVar1 = vpinsrb_avx(auVar1,0x55,5);
      auVar1 = vpinsrb_avx(auVar1,0x55,6);
      auVar1 = vpinsrb_avx(auVar1,0x55,7);
      auVar1 = vpinsrb_avx(auVar1,0x55,8);
      auVar1 = vpinsrb_avx(auVar1,0x55,9);
      auVar1 = vpinsrb_avx(auVar1,0x55,10);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
      auStack_2f0 = vpinsrb_avx(auVar1,0x55,0xf);
      local_e20 = local_300._0_8_;
      uStack_e18 = local_300._8_8_;
      uStack_e10 = auStack_2f0._0_8_;
      uStack_e08 = auStack_2f0._8_8_;
      auVar22._16_8_ = auStack_2f0._0_8_;
      auVar22._0_16_ = local_300;
      auVar22._24_8_ = auStack_2f0._8_8_;
      auVar4 = vpand_avx2(local_e00,auVar22);
      local_1360 = auVar3._0_8_;
      uStack_1358 = auVar3._8_8_;
      uStack_1350 = auVar3._16_8_;
      uStack_1348 = auVar3._24_8_;
      local_1380 = auVar4._0_8_;
      uStack_1378 = auVar4._8_8_;
      uStack_1370 = auVar4._16_8_;
      uStack_1368 = auVar4._24_8_;
      local_4e0 = local_1360;
      uStack_4d8 = uStack_1358;
      uStack_4d0 = uStack_1350;
      uStack_4c8 = uStack_1348;
      local_500 = local_1380;
      uStack_4f8 = uStack_1378;
      uStack_4f0 = uStack_1370;
      uStack_4e8 = uStack_1368;
      auVar4 = vphaddw_avx2(auVar3,auVar4);
      local_1340 = auVar4._0_8_;
      uStack_1338 = auVar4._8_8_;
      uStack_1330 = auVar4._16_8_;
      uStack_1328 = auVar4._24_8_;
      local_643 = 0x33;
      local_281 = 0x33;
      local_282 = 0x33;
      local_283 = 0x33;
      local_284 = 0x33;
      local_285 = 0x33;
      local_286 = 0x33;
      local_287 = 0x33;
      local_288 = 0x33;
      local_289 = 0x33;
      local_28a = 0x33;
      local_28b = 0x33;
      local_28c = 0x33;
      local_28d = 0x33;
      local_28e = 0x33;
      local_28f = 0x33;
      local_290 = 0x33;
      local_291 = 0x33;
      local_292 = 0x33;
      local_293 = 0x33;
      local_294 = 0x33;
      local_295 = 0x33;
      local_296 = 0x33;
      local_297 = 0x33;
      local_298 = 0x33;
      local_299 = 0x33;
      local_29a = 0x33;
      local_29b = 0x33;
      local_29c = 0x33;
      local_29d = 0x33;
      local_29e = 0x33;
      local_29f = 0x33;
      local_2a0 = 0x33;
      auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar1 = vpinsrb_avx(auVar1,0x33,2);
      auVar1 = vpinsrb_avx(auVar1,0x33,3);
      auVar1 = vpinsrb_avx(auVar1,0x33,4);
      auVar1 = vpinsrb_avx(auVar1,0x33,5);
      auVar1 = vpinsrb_avx(auVar1,0x33,6);
      auVar1 = vpinsrb_avx(auVar1,0x33,7);
      auVar1 = vpinsrb_avx(auVar1,0x33,8);
      auVar1 = vpinsrb_avx(auVar1,0x33,9);
      auVar1 = vpinsrb_avx(auVar1,0x33,10);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
      local_2c0 = vpinsrb_avx(auVar1,0x33,0xf);
      auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar1 = vpinsrb_avx(auVar1,0x33,2);
      auVar1 = vpinsrb_avx(auVar1,0x33,3);
      auVar1 = vpinsrb_avx(auVar1,0x33,4);
      auVar1 = vpinsrb_avx(auVar1,0x33,5);
      auVar1 = vpinsrb_avx(auVar1,0x33,6);
      auVar1 = vpinsrb_avx(auVar1,0x33,7);
      auVar1 = vpinsrb_avx(auVar1,0x33,8);
      auVar1 = vpinsrb_avx(auVar1,0x33,9);
      auVar1 = vpinsrb_avx(auVar1,0x33,10);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
      auStack_2b0 = vpinsrb_avx(auVar1,0x33,0xf);
      local_e40 = local_1340;
      uStack_e38 = uStack_1338;
      uStack_e30 = uStack_1330;
      uStack_e28 = uStack_1328;
      local_e60 = local_2c0._0_8_;
      uStack_e58 = local_2c0._8_8_;
      uStack_e50 = auStack_2b0._0_8_;
      uStack_e48 = auStack_2b0._8_8_;
      auVar21._16_8_ = auStack_2b0._0_8_;
      auVar21._0_16_ = local_2c0;
      auVar21._24_8_ = auStack_2b0._8_8_;
      auVar3 = vpand_avx2(auVar4,auVar21);
      local_860 = local_1340;
      uStack_858 = uStack_1338;
      uStack_850 = uStack_1330;
      uStack_848 = uStack_1328;
      local_864 = 2;
      local_e80 = vpsrld_avx2(auVar4,ZEXT416(2));
      local_644 = 0x33;
      local_241 = 0x33;
      local_242 = 0x33;
      local_243 = 0x33;
      local_244 = 0x33;
      local_245 = 0x33;
      local_246 = 0x33;
      local_247 = 0x33;
      local_248 = 0x33;
      local_249 = 0x33;
      local_24a = 0x33;
      local_24b = 0x33;
      local_24c = 0x33;
      local_24d = 0x33;
      local_24e = 0x33;
      local_24f = 0x33;
      local_250 = 0x33;
      local_251 = 0x33;
      local_252 = 0x33;
      local_253 = 0x33;
      local_254 = 0x33;
      local_255 = 0x33;
      local_256 = 0x33;
      local_257 = 0x33;
      local_258 = 0x33;
      local_259 = 0x33;
      local_25a = 0x33;
      local_25b = 0x33;
      local_25c = 0x33;
      local_25d = 0x33;
      local_25e = 0x33;
      local_25f = 0x33;
      local_260 = 0x33;
      auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar1 = vpinsrb_avx(auVar1,0x33,2);
      auVar1 = vpinsrb_avx(auVar1,0x33,3);
      auVar1 = vpinsrb_avx(auVar1,0x33,4);
      auVar1 = vpinsrb_avx(auVar1,0x33,5);
      auVar1 = vpinsrb_avx(auVar1,0x33,6);
      auVar1 = vpinsrb_avx(auVar1,0x33,7);
      auVar1 = vpinsrb_avx(auVar1,0x33,8);
      auVar1 = vpinsrb_avx(auVar1,0x33,9);
      auVar1 = vpinsrb_avx(auVar1,0x33,10);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
      local_280 = vpinsrb_avx(auVar1,0x33,0xf);
      auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
      auVar1 = vpinsrb_avx(auVar1,0x33,2);
      auVar1 = vpinsrb_avx(auVar1,0x33,3);
      auVar1 = vpinsrb_avx(auVar1,0x33,4);
      auVar1 = vpinsrb_avx(auVar1,0x33,5);
      auVar1 = vpinsrb_avx(auVar1,0x33,6);
      auVar1 = vpinsrb_avx(auVar1,0x33,7);
      auVar1 = vpinsrb_avx(auVar1,0x33,8);
      auVar1 = vpinsrb_avx(auVar1,0x33,9);
      auVar1 = vpinsrb_avx(auVar1,0x33,10);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
      auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
      auStack_270 = vpinsrb_avx(auVar1,0x33,0xf);
      local_ea0 = local_280._0_8_;
      uStack_e98 = local_280._8_8_;
      uStack_e90 = auStack_270._0_8_;
      uStack_e88 = auStack_270._8_8_;
      auVar20._16_8_ = auStack_270._0_8_;
      auVar20._0_16_ = local_280;
      auVar20._24_8_ = auStack_270._8_8_;
      auVar4 = vpand_avx2(local_e80,auVar20);
      local_13c0 = auVar3._0_8_;
      uStack_13b8 = auVar3._8_8_;
      uStack_13b0 = auVar3._16_8_;
      uStack_13a8 = auVar3._24_8_;
      local_13e0 = auVar4._0_8_;
      uStack_13d8 = auVar4._8_8_;
      uStack_13d0 = auVar4._16_8_;
      uStack_13c8 = auVar4._24_8_;
      local_520 = local_13c0;
      uStack_518 = uStack_13b8;
      uStack_510 = uStack_13b0;
      uStack_508 = uStack_13a8;
      local_540 = local_13e0;
      uStack_538 = uStack_13d8;
      uStack_530 = uStack_13d0;
      uStack_528 = uStack_13c8;
      auVar4 = vphaddw_avx2(auVar3,auVar4);
      local_13a0 = auVar4._0_8_;
      uStack_1398 = auVar4._8_8_;
      uStack_1390 = auVar4._16_8_;
      uStack_1388 = auVar4._24_8_;
      local_645 = 0xf;
      local_201 = 0xf;
      local_202 = 0xf;
      local_203 = 0xf;
      local_204 = 0xf;
      local_205 = 0xf;
      local_206 = 0xf;
      local_207 = 0xf;
      local_208 = 0xf;
      local_209 = 0xf;
      local_20a = 0xf;
      local_20b = 0xf;
      local_20c = 0xf;
      local_20d = 0xf;
      local_20e = 0xf;
      local_20f = 0xf;
      local_210 = 0xf;
      local_211 = 0xf;
      local_212 = 0xf;
      local_213 = 0xf;
      local_214 = 0xf;
      local_215 = 0xf;
      local_216 = 0xf;
      local_217 = 0xf;
      local_218 = 0xf;
      local_219 = 0xf;
      local_21a = 0xf;
      local_21b = 0xf;
      local_21c = 0xf;
      local_21d = 0xf;
      local_21e = 0xf;
      local_21f = 0xf;
      local_220 = 0xf;
      auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar1 = vpinsrb_avx(auVar1,0xf,2);
      auVar1 = vpinsrb_avx(auVar1,0xf,3);
      auVar1 = vpinsrb_avx(auVar1,0xf,4);
      auVar1 = vpinsrb_avx(auVar1,0xf,5);
      auVar1 = vpinsrb_avx(auVar1,0xf,6);
      auVar1 = vpinsrb_avx(auVar1,0xf,7);
      auVar1 = vpinsrb_avx(auVar1,0xf,8);
      auVar1 = vpinsrb_avx(auVar1,0xf,9);
      auVar1 = vpinsrb_avx(auVar1,0xf,10);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
      local_240 = vpinsrb_avx(auVar1,0xf,0xf);
      auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar1 = vpinsrb_avx(auVar1,0xf,2);
      auVar1 = vpinsrb_avx(auVar1,0xf,3);
      auVar1 = vpinsrb_avx(auVar1,0xf,4);
      auVar1 = vpinsrb_avx(auVar1,0xf,5);
      auVar1 = vpinsrb_avx(auVar1,0xf,6);
      auVar1 = vpinsrb_avx(auVar1,0xf,7);
      auVar1 = vpinsrb_avx(auVar1,0xf,8);
      auVar1 = vpinsrb_avx(auVar1,0xf,9);
      auVar1 = vpinsrb_avx(auVar1,0xf,10);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
      auStack_230 = vpinsrb_avx(auVar1,0xf,0xf);
      local_ec0 = local_13a0;
      uStack_eb8 = uStack_1398;
      uStack_eb0 = uStack_1390;
      uStack_ea8 = uStack_1388;
      local_ee0 = local_240._0_8_;
      uStack_ed8 = local_240._8_8_;
      uStack_ed0 = auStack_230._0_8_;
      uStack_ec8 = auStack_230._8_8_;
      auVar3._16_8_ = auStack_230._0_8_;
      auVar3._0_16_ = local_240;
      auVar3._24_8_ = auStack_230._8_8_;
      auVar3 = vpand_avx2(auVar4,auVar3);
      local_8a0 = local_13a0;
      uStack_898 = uStack_1398;
      uStack_890 = uStack_1390;
      uStack_888 = uStack_1388;
      local_8a4 = 4;
      local_f00 = vpsrld_avx2(auVar4,ZEXT416(4));
      local_646 = 0xf;
      local_1c1 = 0xf;
      local_1c2 = 0xf;
      local_1c3 = 0xf;
      local_1c4 = 0xf;
      local_1c5 = 0xf;
      local_1c6 = 0xf;
      local_1c7 = 0xf;
      local_1c8 = 0xf;
      local_1c9 = 0xf;
      local_1ca = 0xf;
      local_1cb = 0xf;
      local_1cc = 0xf;
      local_1cd = 0xf;
      local_1ce = 0xf;
      local_1cf = 0xf;
      local_1d0 = 0xf;
      local_1d1 = 0xf;
      local_1d2 = 0xf;
      local_1d3 = 0xf;
      local_1d4 = 0xf;
      local_1d5 = 0xf;
      local_1d6 = 0xf;
      local_1d7 = 0xf;
      local_1d8 = 0xf;
      local_1d9 = 0xf;
      local_1da = 0xf;
      local_1db = 0xf;
      local_1dc = 0xf;
      local_1dd = 0xf;
      local_1de = 0xf;
      local_1df = 0xf;
      local_1e0 = 0xf;
      auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar1 = vpinsrb_avx(auVar1,0xf,2);
      auVar1 = vpinsrb_avx(auVar1,0xf,3);
      auVar1 = vpinsrb_avx(auVar1,0xf,4);
      auVar1 = vpinsrb_avx(auVar1,0xf,5);
      auVar1 = vpinsrb_avx(auVar1,0xf,6);
      auVar1 = vpinsrb_avx(auVar1,0xf,7);
      auVar1 = vpinsrb_avx(auVar1,0xf,8);
      auVar1 = vpinsrb_avx(auVar1,0xf,9);
      auVar1 = vpinsrb_avx(auVar1,0xf,10);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
      local_200 = vpinsrb_avx(auVar1,0xf,0xf);
      auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar1 = vpinsrb_avx(auVar1,0xf,2);
      auVar1 = vpinsrb_avx(auVar1,0xf,3);
      auVar1 = vpinsrb_avx(auVar1,0xf,4);
      auVar1 = vpinsrb_avx(auVar1,0xf,5);
      auVar1 = vpinsrb_avx(auVar1,0xf,6);
      auVar1 = vpinsrb_avx(auVar1,0xf,7);
      auVar1 = vpinsrb_avx(auVar1,0xf,8);
      auVar1 = vpinsrb_avx(auVar1,0xf,9);
      auVar1 = vpinsrb_avx(auVar1,0xf,10);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
      auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
      auStack_1f0 = vpinsrb_avx(auVar1,0xf,0xf);
      local_f20 = local_200._0_8_;
      uStack_f18 = local_200._8_8_;
      uStack_f10 = auStack_1f0._0_8_;
      uStack_f08 = auStack_1f0._8_8_;
      auVar19._16_8_ = auStack_1f0._0_8_;
      auVar19._0_16_ = local_200;
      auVar19._24_8_ = auStack_1f0._8_8_;
      auVar4 = vpand_avx2(local_f00,auVar19);
      local_1420 = auVar3._0_8_;
      uStack_1418 = auVar3._8_8_;
      uStack_1410 = auVar3._16_8_;
      uStack_1408 = auVar3._24_8_;
      local_1440 = auVar4._0_8_;
      uStack_1438 = auVar4._8_8_;
      uStack_1430 = auVar4._16_8_;
      uStack_1428 = auVar4._24_8_;
      local_560 = local_1420;
      uStack_558 = uStack_1418;
      uStack_550 = uStack_1410;
      uStack_548 = uStack_1408;
      local_580 = local_1440;
      uStack_578 = uStack_1438;
      uStack_570 = uStack_1430;
      uStack_568 = uStack_1428;
      auVar3 = vphaddw_avx2(auVar3,auVar4);
      local_d04 = 0xff;
      local_384 = 0xff;
      local_388 = 0xff;
      local_38c = 0xff;
      local_390 = 0xff;
      local_394 = 0xff;
      local_398 = 0xff;
      local_39c = 0xff;
      local_3a0 = 0xff;
      auVar1 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
      auVar1 = vpinsrd_avx(auVar1,0xff,2);
      auVar1 = vpinsrd_avx(auVar1,0xff,3);
      auVar2 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
      auVar2 = vpinsrd_avx(auVar2,0xff,2);
      auVar2 = vpinsrd_avx(auVar2,0xff,3);
      auVar28._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      local_3c0._16_8_ = auVar28._16_8_;
      local_3c0._24_8_ = auVar28._24_8_;
      auVar4._16_8_ = local_3c0._16_8_;
      auVar4._0_16_ = auVar28._0_16_;
      auVar4._24_8_ = local_3c0._24_8_;
      local_b40 = vpand_avx2(auVar3,auVar4);
      local_b20 = local_1300._0_8_;
      uStack_b18 = local_1300._8_8_;
      uStack_b10 = local_1300._16_8_;
      uStack_b08 = local_1300._24_8_;
      local_1300 = vpaddd_avx2(local_1300,local_b40);
      local_1400 = auVar3._0_8_;
      uStack_13f8 = auVar3._8_8_;
      uStack_13f0 = auVar3._16_8_;
      uStack_13e8 = auVar3._24_8_;
      local_8e0 = local_1400;
      uStack_8d8 = uStack_13f8;
      uStack_8d0 = uStack_13f0;
      uStack_8c8 = uStack_13e8;
      local_8e4 = 8;
      auVar4 = vpsrld_avx2(auVar3,ZEXT416(8));
      auVar5._16_8_ = local_3c0._16_8_;
      auVar5._0_16_ = auVar28._0_16_;
      auVar5._24_8_ = local_3c0._24_8_;
      local_b80 = vpand_avx2(auVar4,auVar5);
      local_b60 = local_12e0._0_8_;
      uStack_b58 = local_12e0._8_8_;
      uStack_b50 = local_12e0._16_8_;
      uStack_b48 = local_12e0._24_8_;
      local_12e0 = vpaddd_avx2(local_12e0,local_b80);
      local_920 = local_1400;
      uStack_918 = uStack_13f8;
      uStack_910 = uStack_13f0;
      uStack_908 = uStack_13e8;
      local_924 = 0x10;
      auVar4 = vpsrld_avx2(auVar3,ZEXT416(0x10));
      auVar6._16_8_ = local_3c0._16_8_;
      auVar6._0_16_ = auVar28._0_16_;
      auVar6._24_8_ = local_3c0._24_8_;
      local_bc0 = vpand_avx2(auVar4,auVar6);
      local_ba0 = local_12c0._0_8_;
      uStack_b98 = local_12c0._8_8_;
      uStack_b90 = local_12c0._16_8_;
      uStack_b88 = local_12c0._24_8_;
      local_12c0 = vpaddd_avx2(local_12c0,local_bc0);
      local_960 = local_1400;
      uStack_958 = uStack_13f8;
      uStack_950 = uStack_13f0;
      uStack_948 = uStack_13e8;
      local_964 = 0x18;
      auVar3 = vpsrld_avx2(auVar3,ZEXT416(0x18));
      auVar11._16_8_ = local_3c0._16_8_;
      auVar11._0_16_ = auVar28._0_16_;
      auVar11._24_8_ = local_3c0._24_8_;
      local_c00 = vpand_avx2(auVar3,auVar11);
      local_be0 = local_12a0._0_8_;
      uStack_bd8 = local_12a0._8_8_;
      uStack_bd0 = local_12a0._16_8_;
      uStack_bc8 = local_12a0._24_8_;
      local_12a0 = vpaddd_avx2(local_12a0,local_c00);
      b_13[1] = (longlong)in_stack_ffffffffffffea00;
      b_13[0] = (longlong)puVar31;
      b_13[2] = (longlong)in_stack_ffffffffffffea08;
      b_13[3] = (longlong)in_stack_ffffffffffffea10;
      c_13[0]._1_1_ = in_stack_ffffffffffffe9d9;
      c_13[0]._0_1_ = in_stack_ffffffffffffe9d8;
      c_13[0]._2_1_ = in_stack_ffffffffffffe9da;
      c_13[0]._3_1_ = in_stack_ffffffffffffe9db;
      c_13[0]._4_4_ = in_stack_ffffffffffffe9dc;
      c_13[1] = (longlong)in_stack_ffffffffffffe9e0;
      c_13[2] = (longlong)puVar30;
      c_13[3] = (longlong)in_stack_ffffffffffffe9f0;
      local_3c0 = auVar28;
      pospopcnt_csa_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffea34,in_stack_ffffffffffffea30),
                         in_stack_ffffffffffffea28,b_13,c_13);
    }
    local_f40 = local_1180;
    uStack_f38 = uStack_1178;
    uStack_f30 = uStack_1170;
    uStack_f28 = uStack_1168;
    local_647 = 0x55;
    local_1a0 = 0x55;
    auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar1 = vpinsrb_avx(auVar1,0x55,2);
    auVar1 = vpinsrb_avx(auVar1,0x55,3);
    auVar1 = vpinsrb_avx(auVar1,0x55,4);
    auVar1 = vpinsrb_avx(auVar1,0x55,5);
    auVar1 = vpinsrb_avx(auVar1,0x55,6);
    auVar1 = vpinsrb_avx(auVar1,0x55,7);
    auVar1 = vpinsrb_avx(auVar1,0x55,8);
    auVar1 = vpinsrb_avx(auVar1,0x55,9);
    auVar1 = vpinsrb_avx(auVar1,0x55,10);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
    local_1c0 = vpinsrb_avx(auVar1,0x55,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar1 = vpinsrb_avx(auVar1,0x55,2);
    auVar1 = vpinsrb_avx(auVar1,0x55,3);
    auVar1 = vpinsrb_avx(auVar1,0x55,4);
    auVar1 = vpinsrb_avx(auVar1,0x55,5);
    auVar1 = vpinsrb_avx(auVar1,0x55,6);
    auVar1 = vpinsrb_avx(auVar1,0x55,7);
    auVar1 = vpinsrb_avx(auVar1,0x55,8);
    auVar1 = vpinsrb_avx(auVar1,0x55,9);
    auVar1 = vpinsrb_avx(auVar1,0x55,10);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
    auStack_1b0 = vpinsrb_avx(auVar1,0x55,0xf);
    local_f60 = local_1c0._0_8_;
    uStack_f58 = local_1c0._8_8_;
    uStack_f50 = auStack_1b0._0_8_;
    uStack_f48 = auStack_1b0._8_8_;
    auVar18._8_8_ = uStack_1178;
    auVar18._0_8_ = local_1180;
    auVar18._16_8_ = uStack_1170;
    auVar18._24_8_ = uStack_1168;
    auVar17._16_8_ = auStack_1b0._0_8_;
    auVar17._0_16_ = local_1c0;
    auVar17._24_8_ = auStack_1b0._8_8_;
    auVar3 = vpand_avx2(auVar18,auVar17);
    local_9a0 = local_1180;
    uStack_998 = uStack_1178;
    uStack_990 = uStack_1170;
    uStack_988 = uStack_1168;
    local_9a4 = 1;
    auVar25._8_8_ = uStack_1178;
    auVar25._0_8_ = local_1180;
    auVar25._16_8_ = uStack_1170;
    auVar25._24_8_ = uStack_1168;
    local_f80 = vpsrld_avx2(auVar25,ZEXT416(1));
    local_648 = 0x55;
    local_160 = 0x55;
    auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar1 = vpinsrb_avx(auVar1,0x55,2);
    auVar1 = vpinsrb_avx(auVar1,0x55,3);
    auVar1 = vpinsrb_avx(auVar1,0x55,4);
    auVar1 = vpinsrb_avx(auVar1,0x55,5);
    auVar1 = vpinsrb_avx(auVar1,0x55,6);
    auVar1 = vpinsrb_avx(auVar1,0x55,7);
    auVar1 = vpinsrb_avx(auVar1,0x55,8);
    auVar1 = vpinsrb_avx(auVar1,0x55,9);
    auVar1 = vpinsrb_avx(auVar1,0x55,10);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
    local_180 = vpinsrb_avx(auVar1,0x55,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0x55),0x55,1);
    auVar1 = vpinsrb_avx(auVar1,0x55,2);
    auVar1 = vpinsrb_avx(auVar1,0x55,3);
    auVar1 = vpinsrb_avx(auVar1,0x55,4);
    auVar1 = vpinsrb_avx(auVar1,0x55,5);
    auVar1 = vpinsrb_avx(auVar1,0x55,6);
    auVar1 = vpinsrb_avx(auVar1,0x55,7);
    auVar1 = vpinsrb_avx(auVar1,0x55,8);
    auVar1 = vpinsrb_avx(auVar1,0x55,9);
    auVar1 = vpinsrb_avx(auVar1,0x55,10);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x55,0xe);
    auStack_170 = vpinsrb_avx(auVar1,0x55,0xf);
    local_fa0 = local_180._0_8_;
    uStack_f98 = local_180._8_8_;
    uStack_f90 = auStack_170._0_8_;
    uStack_f88 = auStack_170._8_8_;
    auVar16._16_8_ = auStack_170._0_8_;
    auVar16._0_16_ = local_180;
    auVar16._24_8_ = auStack_170._8_8_;
    auVar4 = vpand_avx2(local_f80,auVar16);
    local_14a0 = auVar3._0_8_;
    local_5a0 = local_14a0;
    uStack_1498 = auVar3._8_8_;
    uStack_598 = uStack_1498;
    uStack_1490 = auVar3._16_8_;
    uStack_590 = uStack_1490;
    uStack_1488 = auVar3._24_8_;
    uStack_588 = uStack_1488;
    local_14c0 = auVar4._0_8_;
    local_5c0 = local_14c0;
    uStack_14b8 = auVar4._8_8_;
    uStack_5b8 = uStack_14b8;
    uStack_14b0 = auVar4._16_8_;
    uStack_5b0 = uStack_14b0;
    uStack_14a8 = auVar4._24_8_;
    uStack_5a8 = uStack_14a8;
    auVar4 = vphaddw_avx2(auVar3,auVar4);
    local_1480 = auVar4._0_8_;
    local_fc0 = local_1480;
    uStack_1478 = auVar4._8_8_;
    uStack_fb8 = uStack_1478;
    uStack_1470 = auVar4._16_8_;
    uStack_fb0 = uStack_1470;
    uStack_1468 = auVar4._24_8_;
    uStack_fa8 = uStack_1468;
    local_649 = 0x33;
    in_stack_ffffffffffffe9d8 = 0x33;
    auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar1 = vpinsrb_avx(auVar1,0x33,2);
    auVar1 = vpinsrb_avx(auVar1,0x33,3);
    auVar1 = vpinsrb_avx(auVar1,0x33,4);
    auVar1 = vpinsrb_avx(auVar1,0x33,5);
    auVar1 = vpinsrb_avx(auVar1,0x33,6);
    auVar1 = vpinsrb_avx(auVar1,0x33,7);
    auVar1 = vpinsrb_avx(auVar1,0x33,8);
    auVar1 = vpinsrb_avx(auVar1,0x33,9);
    auVar1 = vpinsrb_avx(auVar1,0x33,10);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
    local_140 = vpinsrb_avx(auVar1,0x33,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar1 = vpinsrb_avx(auVar1,0x33,2);
    auVar1 = vpinsrb_avx(auVar1,0x33,3);
    auVar1 = vpinsrb_avx(auVar1,0x33,4);
    auVar1 = vpinsrb_avx(auVar1,0x33,5);
    auVar1 = vpinsrb_avx(auVar1,0x33,6);
    auVar1 = vpinsrb_avx(auVar1,0x33,7);
    auVar1 = vpinsrb_avx(auVar1,0x33,8);
    auVar1 = vpinsrb_avx(auVar1,0x33,9);
    auVar1 = vpinsrb_avx(auVar1,0x33,10);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
    auStack_130 = vpinsrb_avx(auVar1,0x33,0xf);
    local_fe0 = local_140._0_8_;
    uStack_fd8 = local_140._8_8_;
    uStack_fd0 = auStack_130._0_8_;
    uStack_fc8 = auStack_130._8_8_;
    auVar15._16_8_ = auStack_130._0_8_;
    auVar15._0_16_ = local_140;
    auVar15._24_8_ = auStack_130._8_8_;
    auVar3 = vpand_avx2(auVar4,auVar15);
    local_9e0 = local_1480;
    uStack_9d8 = uStack_1478;
    uStack_9d0 = uStack_1470;
    uStack_9c8 = uStack_1468;
    local_9e4 = 2;
    local_1000 = vpsrld_avx2(auVar4,ZEXT416(2));
    local_64a = 0x33;
    in_stack_ffffffffffffe9d9 = 0x33;
    auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar1 = vpinsrb_avx(auVar1,0x33,2);
    auVar1 = vpinsrb_avx(auVar1,0x33,3);
    auVar1 = vpinsrb_avx(auVar1,0x33,4);
    auVar1 = vpinsrb_avx(auVar1,0x33,5);
    auVar1 = vpinsrb_avx(auVar1,0x33,6);
    auVar1 = vpinsrb_avx(auVar1,0x33,7);
    auVar1 = vpinsrb_avx(auVar1,0x33,8);
    auVar1 = vpinsrb_avx(auVar1,0x33,9);
    auVar1 = vpinsrb_avx(auVar1,0x33,10);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
    local_100 = vpinsrb_avx(auVar1,0x33,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0x33),0x33,1);
    auVar1 = vpinsrb_avx(auVar1,0x33,2);
    auVar1 = vpinsrb_avx(auVar1,0x33,3);
    auVar1 = vpinsrb_avx(auVar1,0x33,4);
    auVar1 = vpinsrb_avx(auVar1,0x33,5);
    auVar1 = vpinsrb_avx(auVar1,0x33,6);
    auVar1 = vpinsrb_avx(auVar1,0x33,7);
    auVar1 = vpinsrb_avx(auVar1,0x33,8);
    auVar1 = vpinsrb_avx(auVar1,0x33,9);
    auVar1 = vpinsrb_avx(auVar1,0x33,10);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x33,0xe);
    auStack_f0 = vpinsrb_avx(auVar1,0x33,0xf);
    local_1020 = local_100._0_8_;
    uStack_1018 = local_100._8_8_;
    uStack_1010 = auStack_f0._0_8_;
    uStack_1008 = auStack_f0._8_8_;
    auVar14._16_8_ = auStack_f0._0_8_;
    auVar14._0_16_ = local_100;
    auVar14._24_8_ = auStack_f0._8_8_;
    auVar4 = vpand_avx2(local_1000,auVar14);
    local_1500 = auVar3._0_8_;
    local_5e0 = local_1500;
    uStack_14f8 = auVar3._8_8_;
    uStack_5d8 = uStack_14f8;
    uStack_14f0 = auVar3._16_8_;
    uStack_5d0 = uStack_14f0;
    uStack_14e8 = auVar3._24_8_;
    uStack_5c8 = uStack_14e8;
    local_1520 = auVar4._0_8_;
    local_600 = local_1520;
    uStack_1518 = auVar4._8_8_;
    uStack_5f8 = uStack_1518;
    uStack_1510 = auVar4._16_8_;
    uStack_5f0 = uStack_1510;
    uStack_1508 = auVar4._24_8_;
    uStack_5e8 = uStack_1508;
    auVar4 = vphaddw_avx2(auVar3,auVar4);
    local_14e0 = auVar4._0_8_;
    local_1040 = local_14e0;
    uStack_14d8 = auVar4._8_8_;
    uStack_1038 = uStack_14d8;
    uStack_14d0 = auVar4._16_8_;
    uStack_1030 = uStack_14d0;
    uStack_14c8 = auVar4._24_8_;
    uStack_1028 = uStack_14c8;
    local_64b = 0xf;
    in_stack_ffffffffffffe9da = 0xf;
    auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar1 = vpinsrb_avx(auVar1,0xf,2);
    auVar1 = vpinsrb_avx(auVar1,0xf,3);
    auVar1 = vpinsrb_avx(auVar1,0xf,4);
    auVar1 = vpinsrb_avx(auVar1,0xf,5);
    auVar1 = vpinsrb_avx(auVar1,0xf,6);
    auVar1 = vpinsrb_avx(auVar1,0xf,7);
    auVar1 = vpinsrb_avx(auVar1,0xf,8);
    auVar1 = vpinsrb_avx(auVar1,0xf,9);
    auVar1 = vpinsrb_avx(auVar1,0xf,10);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
    local_c0 = vpinsrb_avx(auVar1,0xf,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar1 = vpinsrb_avx(auVar1,0xf,2);
    auVar1 = vpinsrb_avx(auVar1,0xf,3);
    auVar1 = vpinsrb_avx(auVar1,0xf,4);
    auVar1 = vpinsrb_avx(auVar1,0xf,5);
    auVar1 = vpinsrb_avx(auVar1,0xf,6);
    auVar1 = vpinsrb_avx(auVar1,0xf,7);
    auVar1 = vpinsrb_avx(auVar1,0xf,8);
    auVar1 = vpinsrb_avx(auVar1,0xf,9);
    auVar1 = vpinsrb_avx(auVar1,0xf,10);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
    auStack_b0 = vpinsrb_avx(auVar1,0xf,0xf);
    local_1060 = local_c0._0_8_;
    uStack_1058 = local_c0._8_8_;
    uStack_1050 = auStack_b0._0_8_;
    uStack_1048 = auStack_b0._8_8_;
    auVar13._16_8_ = auStack_b0._0_8_;
    auVar13._0_16_ = local_c0;
    auVar13._24_8_ = auStack_b0._8_8_;
    auVar3 = vpand_avx2(auVar4,auVar13);
    local_a20 = local_14e0;
    uStack_a18 = uStack_14d8;
    uStack_a10 = uStack_14d0;
    uStack_a08 = uStack_14c8;
    local_a24 = 4;
    local_1080 = vpsrld_avx2(auVar4,ZEXT416(4));
    local_64c = 0xf;
    in_stack_ffffffffffffe9db = 0xf;
    auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar1 = vpinsrb_avx(auVar1,0xf,2);
    auVar1 = vpinsrb_avx(auVar1,0xf,3);
    auVar1 = vpinsrb_avx(auVar1,0xf,4);
    auVar1 = vpinsrb_avx(auVar1,0xf,5);
    auVar1 = vpinsrb_avx(auVar1,0xf,6);
    auVar1 = vpinsrb_avx(auVar1,0xf,7);
    auVar1 = vpinsrb_avx(auVar1,0xf,8);
    auVar1 = vpinsrb_avx(auVar1,0xf,9);
    auVar1 = vpinsrb_avx(auVar1,0xf,10);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
    local_80 = vpinsrb_avx(auVar1,0xf,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar1 = vpinsrb_avx(auVar1,0xf,2);
    auVar1 = vpinsrb_avx(auVar1,0xf,3);
    auVar1 = vpinsrb_avx(auVar1,0xf,4);
    auVar1 = vpinsrb_avx(auVar1,0xf,5);
    auVar1 = vpinsrb_avx(auVar1,0xf,6);
    auVar1 = vpinsrb_avx(auVar1,0xf,7);
    auVar1 = vpinsrb_avx(auVar1,0xf,8);
    auVar1 = vpinsrb_avx(auVar1,0xf,9);
    auVar1 = vpinsrb_avx(auVar1,0xf,10);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
    auStack_70 = vpinsrb_avx(auVar1,0xf,0xf);
    local_10a0 = local_80._0_8_;
    uStack_1098 = local_80._8_8_;
    uStack_1090 = auStack_70._0_8_;
    uStack_1088 = auStack_70._8_8_;
    auVar12._16_8_ = auStack_70._0_8_;
    auVar12._0_16_ = local_80;
    auVar12._24_8_ = auStack_70._8_8_;
    auVar4 = vpand_avx2(local_1080,auVar12);
    local_1560 = auVar3._0_8_;
    local_620 = local_1560;
    uStack_1558 = auVar3._8_8_;
    uStack_618 = uStack_1558;
    uStack_1550 = auVar3._16_8_;
    uStack_610 = uStack_1550;
    uStack_1548 = auVar3._24_8_;
    uStack_608 = uStack_1548;
    local_1580 = auVar4._0_8_;
    local_640 = local_1580;
    uStack_1578 = auVar4._8_8_;
    uStack_638 = uStack_1578;
    uStack_1570 = auVar4._16_8_;
    uStack_630 = uStack_1570;
    uStack_1568 = auVar4._24_8_;
    uStack_628 = uStack_1568;
    auVar3 = vphaddw_avx2(auVar3,auVar4);
    local_d08 = 0xff;
    in_stack_ffffffffffffe9dc = 0xff;
    auVar1 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
    auVar1 = vpinsrd_avx(auVar1,0xff,2);
    auVar1 = vpinsrd_avx(auVar1,0xff,3);
    auVar2 = vpinsrd_avx(ZEXT416(0xff),0xff,1);
    auVar2 = vpinsrd_avx(auVar2,0xff,2);
    auVar2 = vpinsrd_avx(auVar2,0xff,3);
    auVar29._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar29._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    local_380._16_8_ = auVar29._16_8_;
    local_380._24_8_ = auVar29._24_8_;
    local_c20 = local_1300._0_8_;
    uStack_c18 = local_1300._8_8_;
    uStack_c10 = local_1300._16_8_;
    uStack_c08 = local_1300._24_8_;
    auVar7._16_8_ = local_380._16_8_;
    auVar7._0_16_ = auVar29._0_16_;
    auVar7._24_8_ = local_380._24_8_;
    local_c40 = vpand_avx2(auVar3,auVar7);
    local_1300 = vpaddd_avx2(local_1300,local_c40);
    local_c60 = local_12e0._0_8_;
    uStack_c58 = local_12e0._8_8_;
    uStack_c50 = local_12e0._16_8_;
    uStack_c48 = local_12e0._24_8_;
    local_1540 = auVar3._0_8_;
    local_a60 = local_1540;
    uStack_1538 = auVar3._8_8_;
    uStack_a58 = uStack_1538;
    uStack_1530 = auVar3._16_8_;
    uStack_a50 = uStack_1530;
    uStack_1528 = auVar3._24_8_;
    uStack_a48 = uStack_1528;
    local_a64 = 8;
    auVar4 = vpsrld_avx2(auVar3,ZEXT416(8));
    auVar8._16_8_ = local_380._16_8_;
    auVar8._0_16_ = auVar29._0_16_;
    auVar8._24_8_ = local_380._24_8_;
    local_c80 = vpand_avx2(auVar4,auVar8);
    local_12e0 = vpaddd_avx2(local_12e0,local_c80);
    local_ca0 = local_12c0._0_8_;
    uStack_c98 = local_12c0._8_8_;
    uStack_c90 = local_12c0._16_8_;
    uStack_c88 = local_12c0._24_8_;
    local_aa0 = local_1540;
    uStack_a98 = uStack_1538;
    uStack_a90 = uStack_1530;
    uStack_a88 = uStack_1528;
    local_aa4 = 0x10;
    auVar4 = vpsrld_avx2(auVar3,ZEXT416(0x10));
    auVar9._16_8_ = local_380._16_8_;
    auVar9._0_16_ = auVar29._0_16_;
    auVar9._24_8_ = local_380._24_8_;
    local_cc0 = vpand_avx2(auVar4,auVar9);
    local_12c0 = vpaddd_avx2(local_12c0,local_cc0);
    local_ce0 = local_12a0._0_8_;
    uStack_cd8 = local_12a0._8_8_;
    uStack_cd0 = local_12a0._16_8_;
    uStack_cc8 = local_12a0._24_8_;
    local_ae0 = local_1540;
    uStack_ad8 = uStack_1538;
    uStack_ad0 = uStack_1530;
    uStack_ac8 = uStack_1528;
    local_ae4 = 0x18;
    auVar3 = vpsrld_avx2(auVar3,ZEXT416(0x18));
    auVar10._16_8_ = local_380._16_8_;
    auVar10._0_16_ = auVar29._0_16_;
    auVar10._24_8_ = local_380._24_8_;
    local_d00 = vpand_avx2(auVar3,auVar10);
    local_12a0 = vpaddd_avx2(local_12a0,local_d00);
    local_380 = auVar29;
    local_360 = in_stack_ffffffffffffe9dc;
    local_35c = in_stack_ffffffffffffe9dc;
    local_358 = in_stack_ffffffffffffe9dc;
    local_354 = in_stack_ffffffffffffe9dc;
    local_350 = in_stack_ffffffffffffe9dc;
    local_34c = in_stack_ffffffffffffe9dc;
    local_348 = in_stack_ffffffffffffe9dc;
    local_344 = in_stack_ffffffffffffe9dc;
    local_19f = local_1a0;
    local_19e = local_1a0;
    local_19d = local_1a0;
    local_19c = local_1a0;
    local_19b = local_1a0;
    local_19a = local_1a0;
    local_199 = local_1a0;
    local_198 = local_1a0;
    local_197 = local_1a0;
    local_196 = local_1a0;
    local_195 = local_1a0;
    local_194 = local_1a0;
    local_193 = local_1a0;
    local_192 = local_1a0;
    local_191 = local_1a0;
    local_190 = local_1a0;
    local_18f = local_1a0;
    local_18e = local_1a0;
    local_18d = local_1a0;
    local_18c = local_1a0;
    local_18b = local_1a0;
    local_18a = local_1a0;
    local_189 = local_1a0;
    local_188 = local_1a0;
    local_187 = local_1a0;
    local_186 = local_1a0;
    local_185 = local_1a0;
    local_184 = local_1a0;
    local_183 = local_1a0;
    local_182 = local_1a0;
    local_181 = local_1a0;
    local_15f = local_160;
    local_15e = local_160;
    local_15d = local_160;
    local_15c = local_160;
    local_15b = local_160;
    local_15a = local_160;
    local_159 = local_160;
    local_158 = local_160;
    local_157 = local_160;
    local_156 = local_160;
    local_155 = local_160;
    local_154 = local_160;
    local_153 = local_160;
    local_152 = local_160;
    local_151 = local_160;
    local_150 = local_160;
    local_14f = local_160;
    local_14e = local_160;
    local_14d = local_160;
    local_14c = local_160;
    local_14b = local_160;
    local_14a = local_160;
    local_149 = local_160;
    local_148 = local_160;
    local_147 = local_160;
    local_146 = local_160;
    local_145 = local_160;
    local_144 = local_160;
    local_143 = local_160;
    local_142 = local_160;
    local_141 = local_160;
    local_120 = in_stack_ffffffffffffe9d8;
    local_11f = in_stack_ffffffffffffe9d8;
    local_11e = in_stack_ffffffffffffe9d8;
    local_11d = in_stack_ffffffffffffe9d8;
    local_11c = in_stack_ffffffffffffe9d8;
    local_11b = in_stack_ffffffffffffe9d8;
    local_11a = in_stack_ffffffffffffe9d8;
    local_119 = in_stack_ffffffffffffe9d8;
    local_118 = in_stack_ffffffffffffe9d8;
    local_117 = in_stack_ffffffffffffe9d8;
    local_116 = in_stack_ffffffffffffe9d8;
    local_115 = in_stack_ffffffffffffe9d8;
    local_114 = in_stack_ffffffffffffe9d8;
    local_113 = in_stack_ffffffffffffe9d8;
    local_112 = in_stack_ffffffffffffe9d8;
    local_111 = in_stack_ffffffffffffe9d8;
    local_110 = in_stack_ffffffffffffe9d8;
    local_10f = in_stack_ffffffffffffe9d8;
    local_10e = in_stack_ffffffffffffe9d8;
    local_10d = in_stack_ffffffffffffe9d8;
    local_10c = in_stack_ffffffffffffe9d8;
    local_10b = in_stack_ffffffffffffe9d8;
    local_10a = in_stack_ffffffffffffe9d8;
    local_109 = in_stack_ffffffffffffe9d8;
    local_108 = in_stack_ffffffffffffe9d8;
    local_107 = in_stack_ffffffffffffe9d8;
    local_106 = in_stack_ffffffffffffe9d8;
    local_105 = in_stack_ffffffffffffe9d8;
    local_104 = in_stack_ffffffffffffe9d8;
    local_103 = in_stack_ffffffffffffe9d8;
    local_102 = in_stack_ffffffffffffe9d8;
    local_101 = in_stack_ffffffffffffe9d8;
    local_e0 = in_stack_ffffffffffffe9d9;
    local_df = in_stack_ffffffffffffe9d9;
    local_de = in_stack_ffffffffffffe9d9;
    local_dd = in_stack_ffffffffffffe9d9;
    local_dc = in_stack_ffffffffffffe9d9;
    local_db = in_stack_ffffffffffffe9d9;
    local_da = in_stack_ffffffffffffe9d9;
    local_d9 = in_stack_ffffffffffffe9d9;
    local_d8 = in_stack_ffffffffffffe9d9;
    local_d7 = in_stack_ffffffffffffe9d9;
    local_d6 = in_stack_ffffffffffffe9d9;
    local_d5 = in_stack_ffffffffffffe9d9;
    local_d4 = in_stack_ffffffffffffe9d9;
    local_d3 = in_stack_ffffffffffffe9d9;
    local_d2 = in_stack_ffffffffffffe9d9;
    local_d1 = in_stack_ffffffffffffe9d9;
    local_d0 = in_stack_ffffffffffffe9d9;
    local_cf = in_stack_ffffffffffffe9d9;
    local_ce = in_stack_ffffffffffffe9d9;
    local_cd = in_stack_ffffffffffffe9d9;
    local_cc = in_stack_ffffffffffffe9d9;
    local_cb = in_stack_ffffffffffffe9d9;
    local_ca = in_stack_ffffffffffffe9d9;
    local_c9 = in_stack_ffffffffffffe9d9;
    local_c8 = in_stack_ffffffffffffe9d9;
    local_c7 = in_stack_ffffffffffffe9d9;
    local_c6 = in_stack_ffffffffffffe9d9;
    local_c5 = in_stack_ffffffffffffe9d9;
    local_c4 = in_stack_ffffffffffffe9d9;
    local_c3 = in_stack_ffffffffffffe9d9;
    local_c2 = in_stack_ffffffffffffe9d9;
    local_c1 = in_stack_ffffffffffffe9d9;
    local_a0 = in_stack_ffffffffffffe9da;
    local_9f = in_stack_ffffffffffffe9da;
    local_9e = in_stack_ffffffffffffe9da;
    local_9d = in_stack_ffffffffffffe9da;
    local_9c = in_stack_ffffffffffffe9da;
    local_9b = in_stack_ffffffffffffe9da;
    local_9a = in_stack_ffffffffffffe9da;
    local_99 = in_stack_ffffffffffffe9da;
    local_98 = in_stack_ffffffffffffe9da;
    local_97 = in_stack_ffffffffffffe9da;
    local_96 = in_stack_ffffffffffffe9da;
    local_95 = in_stack_ffffffffffffe9da;
    local_94 = in_stack_ffffffffffffe9da;
    local_93 = in_stack_ffffffffffffe9da;
    local_92 = in_stack_ffffffffffffe9da;
    local_91 = in_stack_ffffffffffffe9da;
    local_90 = in_stack_ffffffffffffe9da;
    local_8f = in_stack_ffffffffffffe9da;
    local_8e = in_stack_ffffffffffffe9da;
    local_8d = in_stack_ffffffffffffe9da;
    local_8c = in_stack_ffffffffffffe9da;
    local_8b = in_stack_ffffffffffffe9da;
    local_8a = in_stack_ffffffffffffe9da;
    local_89 = in_stack_ffffffffffffe9da;
    local_88 = in_stack_ffffffffffffe9da;
    local_87 = in_stack_ffffffffffffe9da;
    local_86 = in_stack_ffffffffffffe9da;
    local_85 = in_stack_ffffffffffffe9da;
    local_84 = in_stack_ffffffffffffe9da;
    local_83 = in_stack_ffffffffffffe9da;
    local_82 = in_stack_ffffffffffffe9da;
    local_81 = in_stack_ffffffffffffe9da;
    local_50 = in_stack_ffffffffffffe9db;
    local_4f = in_stack_ffffffffffffe9db;
    local_4e = in_stack_ffffffffffffe9db;
    local_4d = in_stack_ffffffffffffe9db;
    local_4c = in_stack_ffffffffffffe9db;
    local_4b = in_stack_ffffffffffffe9db;
    local_4a = in_stack_ffffffffffffe9db;
    local_49 = in_stack_ffffffffffffe9db;
    local_48 = in_stack_ffffffffffffe9db;
    local_47 = in_stack_ffffffffffffe9db;
    local_46 = in_stack_ffffffffffffe9db;
    local_45 = in_stack_ffffffffffffe9db;
    local_44 = in_stack_ffffffffffffe9db;
    local_43 = in_stack_ffffffffffffe9db;
    local_42 = in_stack_ffffffffffffe9db;
    local_41 = in_stack_ffffffffffffe9db;
    local_40 = in_stack_ffffffffffffe9db;
    local_3f = in_stack_ffffffffffffe9db;
    local_3e = in_stack_ffffffffffffe9db;
    local_3d = in_stack_ffffffffffffe9db;
    local_3c = in_stack_ffffffffffffe9db;
    local_3b = in_stack_ffffffffffffe9db;
    local_3a = in_stack_ffffffffffffe9db;
    local_39 = in_stack_ffffffffffffe9db;
    local_38 = in_stack_ffffffffffffe9db;
    local_37 = in_stack_ffffffffffffe9db;
    local_36 = in_stack_ffffffffffffe9db;
    local_35 = in_stack_ffffffffffffe9db;
    local_34 = in_stack_ffffffffffffe9db;
    local_33 = in_stack_ffffffffffffe9db;
    local_32 = in_stack_ffffffffffffe9db;
    local_31 = in_stack_ffffffffffffe9db;
  }
  auVar3 = vpslld_avx2(local_1300,ZEXT416(4));
  auVar4 = vpslld_avx2(local_12e0,ZEXT416(4));
  auVar5 = vpslld_avx2(local_12c0,ZEXT416(4));
  auVar6 = vpslld_avx2(local_12a0,ZEXT416(4));
  local_1300._0_4_ = auVar3._0_4_;
  local_1300._16_4_ = auVar3._16_4_;
  *local_10b8 = *local_10b8 + local_1300._0_4_ + local_1300._16_4_;
  local_12c0._0_4_ = auVar5._0_4_;
  local_12c0._16_4_ = auVar5._16_4_;
  local_10b8[1] = local_10b8[1] + local_12c0._0_4_ + local_12c0._16_4_;
  local_1300._4_4_ = auVar3._4_4_;
  local_1300._20_4_ = auVar3._20_4_;
  local_10b8[2] = local_10b8[2] + local_1300._4_4_ + local_1300._20_4_;
  local_12c0._4_4_ = auVar5._4_4_;
  local_12c0._20_4_ = auVar5._20_4_;
  local_10b8[3] = local_10b8[3] + local_12c0._4_4_ + local_12c0._20_4_;
  local_1300._8_4_ = auVar3._8_4_;
  local_1300._24_4_ = auVar3._24_4_;
  local_10b8[4] = local_10b8[4] + local_1300._8_4_ + local_1300._24_4_;
  local_12c0._8_4_ = auVar5._8_4_;
  local_12c0._24_4_ = auVar5._24_4_;
  local_10b8[5] = local_10b8[5] + local_12c0._8_4_ + local_12c0._24_4_;
  local_1300._12_4_ = auVar3._12_4_;
  local_1300._28_4_ = auVar3._28_4_;
  local_10b8[6] = local_10b8[6] + local_1300._12_4_ + local_1300._28_4_;
  local_12c0._12_4_ = auVar5._12_4_;
  local_12c0._28_4_ = auVar5._28_4_;
  local_10b8[7] = local_10b8[7] + local_12c0._12_4_ + local_12c0._28_4_;
  local_12e0._0_4_ = auVar4._0_4_;
  local_12e0._16_4_ = auVar4._16_4_;
  local_10b8[8] = local_10b8[8] + local_12e0._0_4_ + local_12e0._16_4_;
  local_12a0._0_4_ = auVar6._0_4_;
  local_12a0._16_4_ = auVar6._16_4_;
  local_10b8[9] = local_10b8[9] + local_12a0._0_4_ + local_12a0._16_4_;
  local_12e0._4_4_ = auVar4._4_4_;
  local_12e0._20_4_ = auVar4._20_4_;
  local_10b8[10] = local_10b8[10] + local_12e0._4_4_ + local_12e0._20_4_;
  local_12a0._4_4_ = auVar6._4_4_;
  local_12a0._20_4_ = auVar6._20_4_;
  local_10b8[0xb] = local_10b8[0xb] + local_12a0._4_4_ + local_12a0._20_4_;
  local_12e0._8_4_ = auVar4._8_4_;
  local_12e0._24_4_ = auVar4._24_4_;
  local_10b8[0xc] = local_10b8[0xc] + local_12e0._8_4_ + local_12e0._24_4_;
  local_12a0._8_4_ = auVar6._8_4_;
  local_12a0._24_4_ = auVar6._24_4_;
  local_10b8[0xd] = local_10b8[0xd] + local_12a0._8_4_ + local_12a0._24_4_;
  local_12e0._12_4_ = auVar4._12_4_;
  local_12e0._28_4_ = auVar4._28_4_;
  local_10b8[0xe] = local_10b8[0xe] + local_12e0._12_4_ + local_12e0._28_4_;
  local_12a0._12_4_ = auVar6._12_4_;
  local_12a0._28_4_ = auVar6._28_4_;
  local_10b8[0xf] = local_12a0._12_4_ + local_12a0._28_4_ + local_10b8[0xf];
  local_1270 = local_1100;
  uStack_1268 = uStack_10f8;
  uStack_1260 = uStack_10f0;
  uStack_1258 = uStack_10e8;
  for (local_15a8 = 0; local_15a8 < 0x10; local_15a8 = local_15a8 + 1) {
    for (local_15ac = 0; local_15ac < 0x10; local_15ac = local_15ac + 1) {
      local_10b8[local_15ac] =
           ((int)((uint)*(ushort *)((long)&local_1270 + local_15a8 * 2) &
                 1 << ((byte)local_15ac & 0x1f)) >> ((byte)local_15ac & 0x1f)) +
           local_10b8[local_15ac];
    }
  }
  local_1270 = local_1120;
  uStack_1268 = uStack_1118;
  uStack_1260 = uStack_1110;
  uStack_1258 = uStack_1108;
  for (local_15b8 = 0; local_15b8 < 0x10; local_15b8 = local_15b8 + 1) {
    for (local_15bc = 0; local_15bc < 0x10; local_15bc = local_15bc + 1) {
      local_10b8[local_15bc] =
           ((int)((uint)*(ushort *)((long)&local_1270 + local_15b8 * 2) &
                 1 << ((byte)local_15bc & 0x1f)) >> ((byte)local_15bc & 0x1f)) * 2 +
           local_10b8[local_15bc];
    }
  }
  local_1270 = local_1140;
  uStack_1268 = uStack_1138;
  uStack_1260 = uStack_1130;
  uStack_1258 = uStack_1128;
  for (local_15c8 = 0; local_15c8 < 0x10; local_15c8 = local_15c8 + 1) {
    for (iVar33 = 0; iVar33 < 0x10; iVar33 = iVar33 + 1) {
      local_10b8[iVar33] =
           ((int)((uint)*(ushort *)((long)&local_1270 + local_15c8 * 2) & 1 << ((byte)iVar33 & 0x1f)
                 ) >> ((byte)iVar33 & 0x1f)) * 4 + local_10b8[iVar33];
    }
  }
  local_1270 = local_1160;
  uStack_1268 = uStack_1158;
  uStack_1260 = uStack_1150;
  uStack_1258 = uStack_1148;
  for (uVar32 = 0; uVar32 < 0x10; uVar32 = uVar32 + 1) {
    for (local_15dc = 0; local_15dc < 0x10; local_15dc = local_15dc + 1) {
      local_10b8[local_15dc] =
           ((int)((uint)*(ushort *)((long)&local_1270 + uVar32 * 2) & 1 << ((byte)local_15dc & 0x1f)
                 ) >> ((byte)local_15dc & 0x1f)) * 8 + local_10b8[local_15dc];
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_harley_seal_improved(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m256i* data = (const __m256i*)array;
    size_t size = len / 16;
    __m256i v1  = _mm256_setzero_si256();
    __m256i v2  = _mm256_setzero_si256();
    __m256i v4  = _mm256_setzero_si256();
    __m256i v8  = _mm256_setzero_si256();
    __m256i v16 = _mm256_setzero_si256();
    __m256i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[16];
    __m256i counter[4];
    for (size_t i = 0; i < 4; ++i) {
        counter[i] = _mm256_setzero_si256();
    }

    while (i < limit) {

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define horizreduce(input, mask, shift, output) \
        __m256i output; \
        { \
            const __m256i tmp0 = _mm256_and_si256(input, mask); \
            const __m256i tmp1 = _mm256_and_si256(_mm256_srli_epi32(input, shift), mask); \
            output = _mm256_hadd_epi16(tmp0, tmp1); \
        }

            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  0), _mm256_loadu_si256(data + i +  1));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i +  2), _mm256_loadu_si256(data + i +  3));
            pospopcnt_csa_avx2(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  4), _mm256_loadu_si256(data + i +  5));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i +  6), _mm256_loadu_si256(data + i +  7));
            pospopcnt_csa_avx2(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i +  8),  _mm256_loadu_si256(data + i +  9));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i + 10),  _mm256_loadu_si256(data + i + 11));
            pospopcnt_csa_avx2(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&twosA,  &v1, _mm256_loadu_si256(data + i + 12),  _mm256_loadu_si256(data + i + 13));
            pospopcnt_csa_avx2(&twosB,  &v1, _mm256_loadu_si256(data + i + 14),  _mm256_loadu_si256(data + i + 15));
            pospopcnt_csa_avx2(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx2(&eightsB,&v4, foursA, foursB);
            {
                horizreduce(v16, _mm256_set1_epi8(0x55), 1, t0); // t0 = 2-bit counters
                horizreduce(t0,  _mm256_set1_epi8(0x33), 2, t1); // t1 = 4-bit counters
                horizreduce(t1,  _mm256_set1_epi8(0x0f), 4, t2); // t2 = 8-bit counters

                const __m256i mask_byte0 = _mm256_set1_epi32(0x000000ff);
                counter[0] = _mm256_add_epi32(counter[0], t2 & mask_byte0);
                counter[1] = _mm256_add_epi32(counter[1], _mm256_srli_epi32(t2, 1*8) & mask_byte0);
                counter[2] = _mm256_add_epi32(counter[2], _mm256_srli_epi32(t2, 2*8) & mask_byte0);
                counter[3] = _mm256_add_epi32(counter[3], _mm256_srli_epi32(t2, 3*8) & mask_byte0);
            }
            pospopcnt_csa_avx2(&v16, &v8, eightsA, eightsB);
        } // for

        // update the counters after the last iteration
        {
            horizreduce(v16, _mm256_set1_epi8(0x55), 1, t0);
            horizreduce(t0,  _mm256_set1_epi8(0x33), 2, t1);
            horizreduce(t1,  _mm256_set1_epi8(0x0f), 4, t2);

            const __m256i mask_byte0 = _mm256_set1_epi32(0x000000ff);
            counter[0] = _mm256_add_epi32(counter[0], t2 & mask_byte0);
            counter[1] = _mm256_add_epi32(counter[1], _mm256_srli_epi32(t2, 1*8) & mask_byte0);
            counter[2] = _mm256_add_epi32(counter[2], _mm256_srli_epi32(t2, 2*8) & mask_byte0);
            counter[3] = _mm256_add_epi32(counter[3], _mm256_srli_epi32(t2, 3*8) & mask_byte0);
        }
#undef horizreduce
    }

    counter[0] = _mm256_slli_epi32(counter[0], 4); // * 16
    counter[1] = _mm256_slli_epi32(counter[1], 4); // * 16
    counter[2] = _mm256_slli_epi32(counter[2], 4); // * 16
    counter[3] = _mm256_slli_epi32(counter[3], 4); // * 16

    flags[0] += _mm256_extract_epi32(counter[0], 0) + _mm256_extract_epi32(counter[0], 4);
    flags[1] += _mm256_extract_epi32(counter[2], 0) + _mm256_extract_epi32(counter[2], 4);
    flags[2] += _mm256_extract_epi32(counter[0], 1) + _mm256_extract_epi32(counter[0], 5);
    flags[3] += _mm256_extract_epi32(counter[2], 1) + _mm256_extract_epi32(counter[2], 5);
    flags[4] += _mm256_extract_epi32(counter[0], 2) + _mm256_extract_epi32(counter[0], 6);
    flags[5] += _mm256_extract_epi32(counter[2], 2) + _mm256_extract_epi32(counter[2], 6);
    flags[6] += _mm256_extract_epi32(counter[0], 3) + _mm256_extract_epi32(counter[0], 7);
    flags[7] += _mm256_extract_epi32(counter[2], 3) + _mm256_extract_epi32(counter[2], 7);

    flags[8]  += _mm256_extract_epi32(counter[1], 0) + _mm256_extract_epi32(counter[1], 4);
    flags[9]  += _mm256_extract_epi32(counter[3], 0) + _mm256_extract_epi32(counter[3], 4);
    flags[10] += _mm256_extract_epi32(counter[1], 1) + _mm256_extract_epi32(counter[1], 5);
    flags[11] += _mm256_extract_epi32(counter[3], 1) + _mm256_extract_epi32(counter[3], 5);
    flags[12] += _mm256_extract_epi32(counter[1], 2) + _mm256_extract_epi32(counter[1], 6);
    flags[13] += _mm256_extract_epi32(counter[3], 2) + _mm256_extract_epi32(counter[3], 6);
    flags[14] += _mm256_extract_epi32(counter[1], 3) + _mm256_extract_epi32(counter[1], 7);
    flags[15] += _mm256_extract_epi32(counter[3], 3) + _mm256_extract_epi32(counter[3], 7);

    _mm256_storeu_si256((__m256i*)buffer, v1);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm256_storeu_si256((__m256i*)buffer, v2);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm256_storeu_si256((__m256i*)buffer, v4);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm256_storeu_si256((__m256i*)buffer, v8);
    for (size_t i = 0; i < 16; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}